

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzprinteg.h
# Opt level: O1

void __thiscall
TPZPrInteg<TPZPrInteg<TPZPrInteg<TPZInt1Point>_>_>::SetOrder
          (TPZPrInteg<TPZPrInteg<TPZPrInteg<TPZInt1Point>_>_> *this,TPZVec<int> *ord,int type)

{
  int *piVar1;
  TPZGaussRule *pTVar2;
  
  if (ord->fNElements < 3) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "TPZPrInteg::SetOrder: number of integration points specified smaller than dimension\n"
               ,0x54);
    return;
  }
  TPZPrInteg<TPZPrInteg<TPZInt1Point>_>::SetOrder
            (&this->super_TPZPrInteg<TPZPrInteg<TPZInt1Point>_>,ord,type);
  piVar1 = ord->fStore;
  this->fOrdKsi = piVar1[2];
  pTVar2 = TPZIntRuleList::GetRule(&TPZIntRuleList::gIntRuleList,piVar1[2],0);
  this->fIntP = pTVar2;
  return;
}

Assistant:

void SetOrder(TPZVec<int> &ord, int type = 0) override
    {
#ifndef PZNODEBUG
		if(ord.NElements() < Dim) {
			std::cout << "TPZPrInteg::SetOrder: number of integration points specified smaller than dimension\n";
			return;
		}
#endif
		TFather::SetOrder(ord,type);
		fOrdKsi = ord[Dim-1];
		fIntP   = TPZIntRuleList::gIntRuleList.GetRule(ord[Dim-1]);
    }